

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

void __thiscall cmSourceFile::cmSourceFile(cmSourceFile *this,cmMakefile *mf,string *name)

{
  bool bVar1;
  string *filename;
  string local_40;
  string *local_20;
  string *name_local;
  cmMakefile *mf_local;
  cmSourceFile *this_local;
  
  local_20 = name;
  name_local = (string *)mf;
  mf_local = (cmMakefile *)this;
  cmSourceFileLocation::cmSourceFileLocation(&this->Location,mf,name);
  cmPropertyMap::cmPropertyMap(&this->Properties);
  std::__cxx11::string::string((string *)&this->Extension);
  std::__cxx11::string::string((string *)&this->Language);
  std::__cxx11::string::string((string *)&this->FullPath);
  std::__cxx11::string::string((string *)&this->ObjectLibrary);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends);
  this->CustomCommand = (cmCustomCommand *)0x0;
  this->FindFullPathFailed = false;
  filename = cmSourceFileLocation::GetName_abi_cxx11_(&this->Location);
  cmsys::SystemTools::GetFilenameLastExtension(&local_40,filename);
  bVar1 = std::operator==(".ui",&local_40);
  this->IsUiFile = bVar1;
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

cmSourceFile::cmSourceFile(cmMakefile* mf, const std::string& name)
  : Location(mf, name)
{
  this->CustomCommand = CM_NULLPTR;
  this->FindFullPathFailed = false;
  this->IsUiFile = (".ui" == cmSystemTools::GetFilenameLastExtension(
                               this->Location.GetName()));
}